

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

int __thiscall
Fl_Table::find_cell(Fl_Table *this,TableContext context,int R,int C,int *X,int *Y,int *W,int *H)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int local_38;
  uint local_34;
  
  local_38 = C;
  local_34 = R;
  iVar2 = row_col_clamp(this,context,(int *)&local_34,&local_38);
  iVar3 = local_38;
  if (iVar2 == 0) {
    lVar7 = (long)local_38;
    lVar4 = col_scroll_position(this,local_38);
    uVar1 = local_34;
    *X = ((int)lVar4 - (int)(this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.value_) +
         this->tix;
    uVar6 = (ulong)local_34;
    lVar4 = row_scroll_position(this,local_34);
    iVar5 = 0;
    *Y = ((int)lVar4 - (int)(this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.value_) +
         this->tiy;
    iVar2 = 0;
    if ((-1 < lVar7) && (iVar3 < (int)(this->_colwidths)._size)) {
      iVar2 = (this->_colwidths).arr[lVar7];
    }
    *W = iVar2;
    if ((-1 < (int)uVar1) && ((int)uVar1 < (int)(this->_rowheights)._size)) {
      iVar5 = (this->_rowheights).arr[uVar6];
    }
    *H = iVar5;
    iVar3 = 0;
    switch(context << 0x1e | context - CONTEXT_ROW_HEADER >> 2) {
    case CONTEXT_NONE:
      *X = this->wix;
      *W = this->_row_header_w;
      iVar3 = 0;
      break;
    case CONTEXT_STARTPAGE:
      *Y = this->wiy;
      *H = this->_col_header_h;
      iVar3 = 0;
      break;
    default:
      fprintf(_stderr,"Fl_Table::find_cell: unknown context %d\n",(ulong)context);
      goto LAB_001cb87d;
    case CONTEXT_ENDPAGE|CONTEXT_STARTPAGE:
    case CONTEXT_ROW_HEADER|CONTEXT_ENDPAGE|CONTEXT_STARTPAGE:
      break;
    }
  }
  else {
    *H = 0;
    *W = 0;
    *Y = 0;
    *X = 0;
LAB_001cb87d:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Fl_Table::find_cell(TableContext context, int R, int C, int &X, int &Y, int &W, int &H) {
  if ( row_col_clamp(context, R, C) ) {		// row or col out of range? error
    X=Y=W=H=0;
    return(-1);
  }
  X = col_scroll_position(C) - hscrollbar->value() + tix;
  Y = row_scroll_position(R) - vscrollbar->value() + tiy;
  W = col_width(C);
  H = row_height(R);
  
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      Y = wiy;
      H = col_header_height();
      return(0);
      
    case CONTEXT_ROW_HEADER:
      X = wix;
      W = row_header_width();
      return(0);
      
    case CONTEXT_CELL:
      return(0);
      
    case CONTEXT_TABLE:
      return(0);
      
      // TODO -- HANDLE OTHER CONTEXTS
    default:
      fprintf(stderr, "Fl_Table::find_cell: unknown context %d\n", (int)context);
      return(-1);
  }
  //NOTREACHED
}